

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

ps_seg_t * ngram_search_seg_iter(ps_search_t *search)

{
  float32 lwf;
  int iVar1;
  ps_lattice_t *dag_00;
  ps_latlink_t *link_00;
  long lVar2;
  double dVar3;
  int32 bpidx;
  ps_seg_t *itor;
  double n_speech;
  ps_latlink_t *link;
  ps_lattice_t *dag;
  ngram_search_t *ngs;
  ps_search_t *search_local;
  
  if ((*(char *)((long)&search[1].name + 2) == '\0') ||
     (*(char *)((long)&search[1].name + 3) == '\0')) {
    iVar1 = ngram_search_find_exit((ngram_search_t *)search,-1,(int32 *)0x0);
    if ((*(char *)((long)&search[1].name + 3) == '\0') ||
       (*(char *)((long)&search[1].name + 1) == '\0')) {
      lwf = 1.0;
    }
    else {
      lwf = *(float32 *)((long)&search[3].dag + 4);
    }
    search_local = (ps_search_t *)ngram_search_bp_iter((ngram_search_t *)search,iVar1,lwf);
  }
  else {
    ptmr_reset((ptmr_t *)&search[5].config);
    ptmr_start((ptmr_t *)&search[5].config);
    dag_00 = ngram_search_lattice(search);
    if (dag_00 == (ps_lattice_t *)0x0) {
      search_local = (ps_search_t *)0x0;
    }
    else {
      link_00 = ngram_search_bestpath(search,(int32 *)0x0,1);
      if (link_00 == (ps_latlink_t *)0x0) {
        search_local = (ps_search_t *)0x0;
      }
      else {
        search_local = (ps_search_t *)ps_lattice_seg_iter(dag_00,link_00,(float32)search[3].n_words)
        ;
        ptmr_stop((ptmr_t *)&search[5].config);
        iVar1 = dag_00->n_frames;
        lVar2 = ps_config_int(search->config,"frate");
        dVar3 = (double)iVar1 / (double)lVar2;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x400,"bestpath %.2f CPU %.3f xRT\n",search[5].acmod,
                (double)search[5].acmod / dVar3);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x403,"bestpath %.2f wall %.3f xRT\n",search[5].dict,(double)search[5].dict / dVar3
               );
      }
    }
  }
  return (ps_seg_t *)search_local;
}

Assistant:

static ps_seg_t *
ngram_search_seg_iter(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    /* Only do bestpath search if the utterance is done. */
    if (ngs->bestpath && ngs->done) {
        ps_lattice_t *dag;
        ps_latlink_t *link;
        double n_speech;
        ps_seg_t *itor;

        ptmr_reset(&ngs->bestpath_perf);
        ptmr_start(&ngs->bestpath_perf);
        if ((dag = ngram_search_lattice(search)) == NULL)
            return NULL;
        if ((link = ngram_search_bestpath(search, NULL, TRUE)) == NULL)
            return NULL;
        itor = ps_lattice_seg_iter(dag, link,
                                   ngs->bestpath_fwdtree_lw_ratio);
        ptmr_stop(&ngs->bestpath_perf);
        n_speech = (double)dag->n_frames
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("bestpath %.2f CPU %.3f xRT\n",
               ngs->bestpath_perf.t_cpu,
               ngs->bestpath_perf.t_cpu / n_speech);
        E_INFO("bestpath %.2f wall %.3f xRT\n",
               ngs->bestpath_perf.t_elapsed,
               ngs->bestpath_perf.t_elapsed / n_speech);
        return itor;
    }
    else {
        int32 bpidx;

        /* fwdtree and fwdflat use same backpointer table. */
        bpidx = ngram_search_find_exit(ngs, -1, NULL);
        return ngram_search_bp_iter(ngs, bpidx,
                                    /* but different language weights... */
                                    (ngs->done && ngs->fwdflat)
                                    ? ngs->fwdflat_fwdtree_lw_ratio : 1.0);
    }

    return NULL;
}